

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::relaxedFmsF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Literal *pLVar1;
  bool bVar2;
  long lVar3;
  Literal *left_00;
  Literal *right_00;
  Literal *this_00;
  bool bVar4;
  undefined1 local_118 [8];
  LaneArray<2> x;
  LaneArray<2> y;
  LaneArray<2> z;
  LaneArray<2> r;
  Literal local_50;
  Literal *local_38;
  
  this_00 = (Literal *)local_118;
  local_38 = __return_storage_ptr__;
  getLanesF64x2((LaneArray<2> *)this_00,this);
  left_00 = (Literal *)&x._M_elems[1].type;
  getLanesF64x2((LaneArray<2> *)left_00,left);
  right_00 = (Literal *)&y._M_elems[1].type;
  getLanesF64x2((LaneArray<2> *)right_00,right);
  r._M_elems[1].field_0.i64 = 0;
  r._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].type.id = 0;
  z._M_elems[1].type.id = 0;
  r._M_elems[0].field_0.i64 = 0;
  pLVar1 = z._M_elems + 1;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    fms(&local_50,this_00,left_00,right_00);
    ~Literal((Literal *)&pLVar1->type);
    Literal((Literal *)&pLVar1->type,&local_50);
    ~Literal(&local_50);
    pLVar1 = r._M_elems;
    right_00 = (Literal *)&z._M_elems[0].type;
    left_00 = (Literal *)&y._M_elems[0].type;
    this_00 = (Literal *)&x._M_elems[0].type;
    bVar2 = false;
  } while (bVar4);
  Literal(local_38,(LaneArray<2> *)&z._M_elems[1].type);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)((long)&z._M_elems[1].type.id + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)((long)&y._M_elems[1].type.id + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)((long)&x._M_elems[1].type.id + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_118 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return local_38;
}

Assistant:

Literal Literal::relaxedFmsF64x2(const Literal& left,
                                 const Literal& right) const {
  return ternary<2, &Literal::getLanesF64x2, &Literal::fms>(*this, left, right);
}